

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O2

void __thiscall avro::GenericUnion::~GenericUnion(GenericUnion *this)

{
  placeholder *ppVar1;
  
  ppVar1 = (this->datum_).value_.content;
  if (ppVar1 != (placeholder *)0x0) {
    (*ppVar1->_vptr_placeholder[1])();
  }
  boost::detail::shared_count::~shared_count(&(this->super_GenericContainer).schema_.pn);
  return;
}

Assistant:

class AVRO_DECL GenericUnion : public GenericContainer {
    size_t curBranch_;
    GenericDatum datum_;

public:
    /**
     * Constructs a generic union corresponding to the given schema \p schema,
     * and the given value. The schema should be of Avro type union
     * and the value should correspond to one of the branches of the union.
     */
    GenericUnion(const NodePtr& schema) :
        GenericContainer(AVRO_UNION, schema), curBranch_(schema->leaves()) {
    }

    /**
     * Returns the index of the current branch.
     */
    size_t currentBranch() const { return curBranch_; }

    /**
     * Selects a new branch. The type for the value is changed accordingly.
     * \param branch The index for the selected branch.
     */
    void selectBranch(size_t branch) {
        if (curBranch_ != branch) {
            datum_ = GenericDatum(schema()->leafAt(branch));
            curBranch_ = branch;
        }
    }

    /**
     * Returns the datum corresponding to the currently selected branch
     * in this union.
     */
    GenericDatum& datum() {
        return datum_;
    }

    /**
     * Returns the datum corresponding to the currently selected branch
     * in this union.
     */
    const GenericDatum& datum() const {
        return datum_;
    }
}